

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

Index * __thiscall libDAI::Index::operator=(Index *this,Index *ind)

{
  Index *in_RSI;
  Index *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000088;
  vector<int,_std::allocator<int>_> *in_stack_00000090;
  
  if (in_RDI != in_RSI) {
    in_RDI->_index = in_RSI->_index;
    std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000090,in_stack_00000088);
    std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000090,in_stack_00000088);
    std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000090,in_stack_00000088);
  }
  return in_RDI;
}

Assistant:

Index & operator=(const Index & ind) {
            if(this!=&ind) {
                _index = ind._index;
                _count = ind._count;
                _max = ind._max;
                _sum = ind._sum;
            }
            return *this;
        }